

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O3

void __thiscall UEFITool::extract(UEFITool *this,UINT8 mode)

{
  int iVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  UINT8 UVar6;
  byte bVar7;
  char cVar8;
  USTATUS errorCode;
  QByteArrayView QVar9;
  QString t;
  QFile outputFile;
  QString t_2;
  QString t_1;
  QByteArray extracted;
  QModelIndex index;
  QArrayData *local_f8;
  char16_t *pcStack_f0;
  qsizetype local_e8;
  QArrayData *local_d8;
  char16_t *pcStack_d0;
  qsizetype qStack_c8;
  QString local_b8;
  QArrayData *local_a0;
  char16_t *local_98;
  qsizetype qStack_90;
  QString local_88;
  QString local_68;
  QByteArray local_48;
  QModelIndex local_30;
  
  QAbstractItemView::selectionModel();
  QItemSelectionModel::currentIndex();
  if (local_30.r < 0) {
    return;
  }
  if (local_30.c < 0) {
    return;
  }
  if (local_30.m == (QAbstractItemModel *)0x0) {
    return;
  }
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char *)0x0;
  local_48.d.size = 0;
  local_68.d.size = 0;
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  errorCode = FfsOperations::extract(this->ffsOps,&local_30,&local_68,&local_48,mode);
  if (errorCode == 0) {
    local_d8 = &((this->currentDir).d.d)->super_QArrayData;
    pcStack_d0 = (this->currentDir).d.ptr;
    qStack_c8 = (this->currentDir).d.size;
    if (local_d8 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_d8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_d8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QChar)(char16_t)&local_d8);
    local_88.d.d = (Data *)local_d8;
    local_88.d.ptr = pcStack_d0;
    local_88.d.size = qStack_c8;
    if (local_d8 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_d8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_d8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QString *)&local_88);
    QDir::toNativeSeparators((QString *)&local_f8);
    pcVar5 = local_68.d.ptr;
    pDVar4 = local_68.d.d;
    qVar3 = local_e8;
    pQVar2 = local_f8;
    local_f8 = &(local_68.d.d)->super_QArrayData;
    local_68.d.d = (Data *)pQVar2;
    local_68.d.ptr = pcStack_f0;
    pcStack_f0 = pcVar5;
    local_e8 = local_68.d.size;
    local_68.d.size = qVar3;
    if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar4->super_QArrayData,2,8);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_d8 != (QArrayData *)0x0) {
      LOCK();
      (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d8,2,8);
      }
    }
    UVar6 = TreeModel::type(this->model,&local_30);
    bVar7 = TreeModel::subtype(this->model,&local_30);
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char16_t *)0x0;
    local_88.d.size = 0;
    if (mode == '\0') {
      switch(UVar6) {
      case '=':
        QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d2474);
        operator+(&local_b8,&local_68,".cap");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d248e);
        QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
        break;
      case '>':
        QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d24b9);
        operator+(&local_b8,&local_68,".rom");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d24d1);
        QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
        break;
      case '?':
        QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d24fa);
        operator+(&local_b8,&local_68,".rgn");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d2513);
        QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
        break;
      case '@':
        QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d253d);
        operator+(&local_b8,&local_68,".pad");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d2557);
        QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
        break;
      case 'A':
        QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d2582);
        operator+(&local_b8,&local_68,".vol");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d259b);
        QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
        break;
      case 'B':
        QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d25c5);
        operator+(&local_b8,&local_68,".ffs");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d25e0);
        QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
        break;
      case 'C':
        QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d2607);
        operator+(&local_b8,&local_68,".sct");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d2621);
        QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
        break;
      default:
        QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d264c);
        operator+(&local_b8,&local_68,".bin");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d2665);
        QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
      }
LAB_0012a6af:
      pcVar5 = local_88.d.ptr;
      pDVar4 = local_88.d.d;
      qVar3 = local_e8;
      pQVar2 = local_f8;
      local_f8 = &(local_88.d.d)->super_QArrayData;
      local_88.d.d = (Data *)pQVar2;
      local_88.d.ptr = pcStack_f0;
      pcStack_f0 = pcVar5;
      local_e8 = local_88.d.size;
      local_88.d.size = qVar3;
      if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar4->super_QArrayData,2,8);
        }
      }
      if (local_a0 != (QArrayData *)0x0) {
        LOCK();
        (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a0,2,8);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_d8 != (QArrayData *)0x0) {
        LOCK();
        (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        iVar1 = (local_d8->ref_)._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        local_b8.d.d = (Data *)local_d8;
joined_r0x0012a05f:
        if (iVar1 == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
        }
      }
    }
    else {
      if (mode < 3) {
        switch(UVar6) {
        case '=':
          QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d2689);
          operator+(&local_b8,&local_68,".rom");
          QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d24d1);
          QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
          break;
        default:
switchD_00129dbc_caseD_3e:
          QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d27c8);
          operator+(&local_b8,&local_68,".bin");
          QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d2665);
          QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
          break;
        case 'A':
          QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d26a9);
          operator+(&local_b8,&local_68,".vbd");
          QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d26c7);
          QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
          break;
        case 'B':
          QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d26f6);
          operator+(&local_b8,&local_68,".fbd");
          QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d2716);
          QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
          break;
        case 'C':
          if (bVar7 - 0x10 < 3) {
            QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d2768);
            operator+(&local_b8,&local_68,".efi");
            QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d2796);
            QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
          }
          else {
            if (bVar7 != 0x17) goto switchD_00129dbc_caseD_3e;
            QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d2747);
            operator+(&local_b8,&local_68,".vol");
            QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d259b);
            QFileDialog::getSaveFileName(&local_f8,this,&local_d8,&local_b8,&local_a0,0,0);
          }
        }
        goto LAB_0012a6af;
      }
      QMetaObject::tr((char *)&local_b8,(char *)&staticMetaObject,0x1d264c);
      local_a0 = &(local_68.d.d)->super_QArrayData;
      local_98 = local_68.d.ptr;
      qStack_90 = local_68.d.size;
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar9.m_data = (storage_type *)0x4;
      QVar9.m_size = (qsizetype)&local_f8;
      QString::fromUtf8(QVar9);
      QString::append((QString *)&local_a0);
      if (local_f8 != (QArrayData *)0x0) {
        LOCK();
        (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_f8,2,8);
        }
      }
      QMetaObject::tr((char *)&local_f8,(char *)&staticMetaObject,0x1d2665);
      QFileDialog::getSaveFileName(&local_d8,this,&local_b8,&local_a0,&local_f8,0,0);
      pcVar5 = local_88.d.ptr;
      pDVar4 = local_88.d.d;
      qVar3 = qStack_c8;
      pQVar2 = local_d8;
      local_d8 = &(local_88.d.d)->super_QArrayData;
      local_88.d.d = (Data *)pQVar2;
      local_88.d.ptr = pcStack_d0;
      pcStack_d0 = pcVar5;
      qStack_c8 = local_88.d.size;
      local_88.d.size = qVar3;
      if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar4->super_QArrayData,2,8);
        }
      }
      if (local_f8 != (QArrayData *)0x0) {
        LOCK();
        (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_f8,2,8);
        }
      }
      if (local_a0 != (QArrayData *)0x0) {
        LOCK();
        (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a0,2,8);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        iVar1 = ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        goto joined_r0x0012a05f;
      }
    }
    QString::trimmed_helper((QString *)&local_f8);
    qVar3 = local_e8;
    if (local_f8 != (QArrayData *)0x0) {
      LOCK();
      (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_f8,2,8);
      }
    }
    if (qVar3 != 0) {
      QFile::QFile((QFile *)&local_b8);
      QFile::setFileName((QString *)&local_b8);
      cVar8 = QFile::open(&local_b8,2);
      if (cVar8 == '\0') {
        QMetaObject::tr((char *)&local_f8,(char *)&staticMetaObject,0x1d2462);
        QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1d27e1);
        QMessageBox::critical(this,&local_f8,&local_d8,0x400,0);
        if (local_d8 != (QArrayData *)0x0) {
          LOCK();
          (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_d8,2,8);
          }
        }
        if (local_f8 != (QArrayData *)0x0) {
          LOCK();
          (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_f8,2,8);
          }
        }
      }
      else {
        QFile::resize((longlong)&local_b8);
        QIODevice::write((QByteArray *)&local_b8);
        QFileDevice::close();
      }
      QFile::~QFile((QFile *)&local_b8);
    }
    if (&(local_88.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0012a8dc;
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar2 = &(local_88.d.d)->super_QArrayData;
  }
  else {
    QMetaObject::tr((char *)&local_f8,(char *)&staticMetaObject,0x1d2462);
    errorCodeToUString(&local_88,errorCode);
    QMessageBox::critical(this,&local_f8,&local_88,0x400,0);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_f8 == (QArrayData *)0x0) goto LAB_0012a8dc;
    LOCK();
    (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = (local_f8->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar2 = local_f8;
  }
  if (iVar1 == 0) {
    QArrayData::deallocate(pQVar2,2,8);
  }
LAB_0012a8dc:
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,8);
    }
  }
  return;
}

Assistant:

void UEFITool::extract(const UINT8 mode)
{
    QModelIndex index = ui->structureTreeView->selectionModel()->currentIndex();
    if (!index.isValid())
        return;
    
    QByteArray extracted;
    QString name;
    USTATUS result = ffsOps->extract(index, name, extracted, mode);
    if (result) {
        QMessageBox::critical(this, tr("Extraction failed"), errorCodeToUString(result), QMessageBox::Ok);
        return;
    }
    
    name = QDir::toNativeSeparators(currentDir + QDir::separator() + name);
    
    //ui->statusBar->showMessage(name);
    
    UINT8 type = model->type(index);
    UINT8 subtype = model->subtype(index);
    QString path;
    if (mode == EXTRACT_MODE_AS_IS) {
        switch (type) {
            case Types::Capsule: path = QFileDialog::getSaveFileName(this, tr("Save capsule to file"), name + ".cap",  tr("Capsule files (*.cap *.bin);;All files (*)")); break;
            case Types::Image:   path = QFileDialog::getSaveFileName(this, tr("Save image to file"), name + ".rom",  tr("Image files (*.rom *.bin);;All files (*)")); break;
            case Types::Region:  path = QFileDialog::getSaveFileName(this, tr("Save region to file"), name + ".rgn",  tr("Region files (*.rgn *.bin);;All files (*)")); break;
            case Types::Padding: path = QFileDialog::getSaveFileName(this, tr("Save padding to file"), name + ".pad",  tr("Padding files (*.pad *.bin);;All files (*)")); break;
            case Types::Volume:  path = QFileDialog::getSaveFileName(this, tr("Save volume to file"), name + ".vol",  tr("Volume files (*.vol *.bin);;All files (*)")); break;
            case Types::File:    path = QFileDialog::getSaveFileName(this, tr("Save FFS file to file"), name + ".ffs",  tr("FFS files (*.ffs *.bin);;All files (*)")); break;
            case Types::Section: path = QFileDialog::getSaveFileName(this, tr("Save section to file"), name + ".sct",  tr("Section files (*.sct *.bin);;All files (*)")); break;
            default:             path = QFileDialog::getSaveFileName(this, tr("Save object to file"), name + ".bin", tr("Binary files (*.bin);;All files (*)"));
        }
    }
    else if (mode == EXTRACT_MODE_BODY || mode == EXTRACT_MODE_BODY_UNCOMPRESSED) {
        switch (type) {
            case Types::Capsule: path = QFileDialog::getSaveFileName(this, tr("Save capsule body to image file"), name + ".rom", tr("Image files (*.rom *.bin);;All files (*)")); break;
            case Types::Volume:  path = QFileDialog::getSaveFileName(this, tr("Save volume body to file"), name + ".vbd", tr("Volume body files (*.vbd *.bin);;All files (*)")); break;
            case Types::File:    path = QFileDialog::getSaveFileName(this, tr("Save FFS file body to file"), name + ".fbd", tr("FFS file body files (*.fbd *.bin);;All files (*)")); break;
            case Types::Section:
                if (subtype == EFI_SECTION_FIRMWARE_VOLUME_IMAGE) {
                    path = QFileDialog::getSaveFileName(this, tr("Save section body to volume file"), name + ".vol", tr("Volume files (*.vol *.bin);;All files (*)")); break;
                }
                else if (subtype == EFI_SECTION_PE32
                         || subtype == EFI_SECTION_TE
                         || subtype == EFI_SECTION_PIC) {
                    path = QFileDialog::getSaveFileName(this, tr("Save section body to EFI executable file"), name + ".efi", tr("EFI executable files (*.efi *.bin);;All files (*)")); break;
                }
            default: path = QFileDialog::getSaveFileName(this, tr("Save object body to file"), name + ".bin", tr("Binary files (*.bin);;All files (*)"));
        }
    }
    else path = QFileDialog::getSaveFileName(this, tr("Save object to file"), name + ".bin", tr("Binary files (*.bin);;All files (*)"));
    
    if (path.trimmed().isEmpty())
        return;
    
    QFile outputFile;
    outputFile.setFileName(path);
    if (!outputFile.open(QFile::WriteOnly)) {
        QMessageBox::critical(this, tr("Extraction failed"), tr("Can't open output file for rewriting"), QMessageBox::Ok);
        return;
    }
    outputFile.resize(0);
    outputFile.write(extracted);
    outputFile.close();
}